

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

__ssize_t __thiscall
Common::TextFile::getline_abi_cxx11_(TextFile *this,char **__lineptr,size_t *__n,FILE *__stream)

{
  char cVar1;
  size_t sVar2;
  long lVar3;
  size_t __n_00;
  size_t len;
  element_type *__dest;
  _List_node_base *p_Var4;
  charptr result;
  list<Common::charptr,_std::allocator<Common::charptr>_> strlist;
  allocator local_79;
  charptr local_78;
  long local_60;
  string *local_58;
  _List_base<Common::charptr,_std::allocator<Common::charptr>_> local_50;
  size_t local_38;
  
  local_50._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_50;
  local_50._M_impl._M_node._M_size = 0;
  lVar3 = 0;
  local_50._M_impl._M_node.super__List_node_base._M_prev =
       local_50._M_impl._M_node.super__List_node_base._M_next;
  while( true ) {
    charptr::charptr(&local_78,0x100);
    std::__cxx11::list<Common::charptr,_std::allocator<Common::charptr>_>::push_back
              ((list<Common::charptr,_std::allocator<Common::charptr>_> *)&local_50,&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    p_Var4 = local_50._M_impl._M_node.super__List_node_base._M_prev;
    fgets((char *)local_50._M_impl._M_node.super__List_node_base._M_prev[1]._M_prev,0x101,
          (FILE *)*__lineptr);
    cVar1 = *(char *)((long)&p_Var4[1]._M_prev[0xf]._M_prev + 7);
    if ((cVar1 == '\0') || (cVar1 == '\n')) break;
    lVar3 = lVar3 + 0x100;
  }
  sVar2 = charptr::length((charptr *)(p_Var4 + 1));
  len = sVar2 + lVar3;
  if (len == 0) {
    std::__cxx11::string::string((string *)this,"",(allocator *)&local_78);
  }
  else {
    local_60 = len - 1;
    local_58 = (string *)this;
    local_38 = sVar2;
    charptr::charptr(&local_78,len);
    p_Var4 = (_List_node_base *)&local_50;
    __dest = local_78._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    while (this = (TextFile *)local_58,
          p_Var4 = (((_List_impl *)&p_Var4->_M_next)->_M_node).super__List_node_base._M_next,
          p_Var4 != (_List_node_base *)&local_50) {
      __n_00 = 0x100;
      if (len < 0x100) {
        __n_00 = len;
      }
      memcpy(__dest,p_Var4[1]._M_prev,__n_00);
      __dest = __dest + __n_00;
      len = len - __n_00;
    }
    if (local_78._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        [lVar3 + -1 + local_38] == '\n') {
      local_78._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      [lVar3 + (local_38 - 1)] = '\0';
    }
    if ((local_60 != 0) &&
       (local_78._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        [lVar3 + -2 + local_38] == '\r')) {
      local_78._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      [lVar3 + (local_38 - 2)] = '\0';
    }
    std::__cxx11::string::string
              (local_58,local_78._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_79);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__cxx11::_List_base<Common::charptr,_std::allocator<Common::charptr>_>::_M_clear(&local_50);
  return (__ssize_t)(string *)this;
}

Assistant:

std::string TextFile::getline() {
	std::list<charptr> strlist;
	const size_t size = 0x100;
	size_t length = 0;

	while (true) {
		strlist.push_back(charptr(size));
		charptr &buffer = strlist.back();

		fgets(buffer.get(), size + 1, _file.get());

		// Line:
		//  Linux:   \n
		//  Windows: \r\n

		char c = buffer[size - 1];
		if (c == '\0' || c == '\n') {
			length += buffer.length();
			break;
		}
		else {
			length += size;
		}
	}

	if (length == 0)
		return "";

	charptr result(length); // The std::string end without '\0'
	size_t reclen = length;

	auto iter = result.get();

	for (auto &str : strlist) {
		size_t step = reclen < size ? reclen : size;
		std::memcpy(iter, str.get(), step);
		iter += step;
		reclen -= step;
	}

	// Remove \n, \r
	if (result[length - 1] == '\n')
		result[length - 1] = '\0';
	if (length >= 2 && result[length - 2] == '\r')
		result[length - 2] = '\0';

	return result.get(); // Remove '\0
}